

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpillPointers.cpp
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::SpillPointers::create(SpillPointers *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x3b8);
  memset(__s,0,0x3b8);
  *__s = (_func_int *)&PTR__Pass_00d87048;
  __s[1] = (_func_int *)0x0;
  __s[2] = (_func_int *)(__s + 4);
  __s[3] = (_func_int *)0x0;
  *(undefined1 *)(__s + 4) = 0;
  __s[6] = (_func_int *)0x0;
  __s[7] = (_func_int *)0x0;
  __s[0x2c] = (_func_int *)0x0;
  __s[0x2d] = (_func_int *)0x0;
  __s[0x2e] = (_func_int *)0x0;
  __s[0x1c] = (_func_int *)0x0;
  __s[0x1d] = (_func_int *)0x0;
  __s[0x1e] = (_func_int *)0x0;
  __s[0x1f] = (_func_int *)0x0;
  __s[0x20] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x39) = 0;
  __s[0x3a] = (_func_int *)0x0;
  __s[0x31] = (_func_int *)0x0;
  __s[0x32] = (_func_int *)0x0;
  __s[0x33] = (_func_int *)0x0;
  __s[0x34] = (_func_int *)0x0;
  __s[0x35] = (_func_int *)0x0;
  __s[0x36] = (_func_int *)0x0;
  __s[0x3b] = (_func_int *)(__s + 0x39);
  __s[0x3c] = (_func_int *)(__s + 0x39);
  *(undefined4 *)(__s + 0x54) = 0;
  __s[0x55] = (_func_int *)0x0;
  memset(__s + 0x3d,0,0xb0);
  __s[0x56] = (_func_int *)(__s + 0x54);
  __s[0x57] = (_func_int *)(__s + 0x54);
  __s[0x58] = (_func_int *)0x0;
  __s[0x5a] = (_func_int *)(__s + 0x60);
  __s[0x5b] = (_func_int *)0x1;
  __s[0x5c] = (_func_int *)0x0;
  __s[0x5d] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x5e) = 0x3f800000;
  __s[0x5f] = (_func_int *)0x0;
  __s[0x60] = (_func_int *)0x0;
  __s[0x61] = (_func_int *)0x0;
  __s[0x62] = (_func_int *)0x0;
  __s[99] = (_func_int *)0x0;
  __s[100] = (_func_int *)(__s + 0x6a);
  __s[0x65] = (_func_int *)0x1;
  __s[0x66] = (_func_int *)0x0;
  __s[0x67] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x68) = 0x3f800000;
  __s[0x69] = (_func_int *)0x0;
  __s[0x6a] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x6b) = 0;
  __s[0x6c] = (_func_int *)0x0;
  __s[0x6d] = (_func_int *)0x0;
  __s[0x6e] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__SpillPointers_00d8b590;
  __s[0x6f] = (_func_int *)(__s + 0x75);
  __s[0x70] = (_func_int *)0x1;
  __s[0x71] = (_func_int *)0x0;
  __s[0x72] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x73) = 0x3f800000;
  __s[0x74] = (_func_int *)0x0;
  __s[0x75] = (_func_int *)0x0;
  __s[0x76] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<SpillPointers>();
  }